

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void print_args(float x,float y)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"The arguments are ",0x12);
  poVar1 = std::ostream::_M_insert<double>((double)x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," and ",5);
  poVar1 = std::ostream::_M_insert<double>((double)y);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void print_args(float x, float y)
{
    std::cout << "The arguments are " << x << " and " << y << std::endl;
}